

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall ads1_twins1_Test::TestBody(ads1_twins1_Test *this)

{
  char *message;
  uint64_t expected;
  uint64_t res;
  AssertHelper AStack_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  unsigned_long local_18;
  unsigned_long local_10;
  
  local_10 = twinPrimes(2,10);
  local_18 = 2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_28,"expected","res",&local_18,&local_10);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/NNTU-CS[P]ADS-1/test/tests.cpp"
               ,0x32,message);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  return;
}

Assistant:

TEST(ads1, twins1) {
  uint64_t res = twinPrimes(2, 10);
  uint64_t expected = 2;
  EXPECT_EQ(expected, res);
}